

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O1

void do_cmd_time(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  
  uVar1 = (uint)z_info->day_length * 10;
  iVar3 = turn % (int)uVar1 + (uVar1 >> 2);
  iVar2 = (iVar3 * 0x18) / (int)uVar1;
  iVar2 = iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 2) - (iVar2 >> 0x1f)) * -0x18;
  uVar4 = iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) * -0xc;
  uVar6 = 0xc;
  if (uVar4 != 0) {
    uVar6 = (ulong)uVar4;
  }
  pcVar5 = "PM";
  if (iVar2 < 0xc) {
    pcVar5 = "AM";
  }
  msg("This is day %d. The time is %d:%02d %s.",(ulong)(turn / (int)uVar1 + 1),uVar6,
      (ulong)(uint)(((iVar3 * 0x5a0) / (int)uVar1) % 0x3c),pcVar5);
  return;
}

Assistant:

void do_cmd_time(void)
{
	int32_t len = 10L * z_info->day_length;
	int32_t tick = turn % len + len / 4;

	int day = turn / len + 1;
	int hour = (24 * tick / len) % 24;
	int min = (1440 * tick / len) % 60;


	/* Message */
	msg("This is day %d. The time is %d:%02d %s.", day,
		(hour % 12 == 0) ? 12 : (hour % 12), min,
		(hour < 12) ? "AM" : "PM");
}